

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O2

void Nwk_ManDeleteNode(Nwk_Obj_t *pObj)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  Nwk_Obj_t *pFanin;
  int iVar3;
  
  if (pObj->nFanouts != 0) {
    __assert_fail("Nwk_ObjFanoutNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkObj.c"
                  ,0xa0,"void Nwk_ManDeleteNode(Nwk_Obj_t *)");
  }
  pVVar2 = pObj->pMan->vTemp;
  Nwk_ObjCollectFanins(pObj,pVVar2);
  for (iVar3 = 0; iVar3 < pVVar2->nSize; iVar3 = iVar3 + 1) {
    pFanin = (Nwk_Obj_t *)Vec_PtrEntry(pVVar2,iVar3);
    Nwk_ObjDeleteFanin(pObj,pFanin);
  }
  iVar3 = pObj->Id;
  if ((-1 < (long)iVar3) && (pVVar2 = pObj->pMan->vObjs, iVar3 < pVVar2->nSize)) {
    pVVar2->pArray[iVar3] = (void *)0x0;
    piVar1 = pObj->pMan->nObjs + (*(uint *)&pObj->field_0x20 & 7);
    *piVar1 = *piVar1 + -1;
    *(undefined8 *)&pObj->field_0x20 = 0;
    pObj->TravId = 0;
    pObj->Level = 0;
    pObj->nFanouts = 0;
    pObj->nFanioAlloc = 0;
    pObj->pFanio = (Nwk_Obj_t **)0x0;
    pObj->tArrival = 0.0;
    pObj->tRequired = 0.0;
    pObj->tSlack = 0.0;
    pObj->nFanins = 0;
    pObj->pCopy = (void *)0x0;
    (pObj->field_3).pNext = (void *)0x0;
    pObj->pMan = (Nwk_Man_t *)0x0;
    pObj->pFunc = (Hop_Obj_t *)0x0;
    pObj->Id = -1;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

void Nwk_ManDeleteNode( Nwk_Obj_t * pObj )
{
    Vec_Ptr_t * vNodes = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    int i;
    assert( Nwk_ObjFanoutNum(pObj) == 0 );
    // delete fanins
    Nwk_ObjCollectFanins( pObj, vNodes );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pTemp, i )
        Nwk_ObjDeleteFanin( pObj, pTemp );
    // remove from the list of objects
    Vec_PtrWriteEntry( pObj->pMan->vObjs, pObj->Id, NULL );
    pObj->pMan->nObjs[pObj->Type]--;
    memset( pObj, 0, sizeof(Nwk_Obj_t) );
    pObj->Id = -1;
}